

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O1

Node * __thiscall Rectangles::update(Rectangles *this,Node *root)

{
  Renderer *pRVar1;
  double dVar2;
  vec2 vVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint *bits;
  undefined4 extraout_var;
  long lVar9;
  ostream *poVar10;
  TextureNode *child;
  uint uVar11;
  ulong uVar12;
  float extraout_XMM0_Da;
  float fVar13;
  float extraout_XMM0_Db;
  rect2d rect;
  rect2d rect_00;
  vec4 color;
  Texture *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Node *local_58;
  Rectangles *local_50;
  undefined1 local_48 [16];
  Texture *pTVar8;
  
  local_48._8_8_ = local_48._0_8_;
  local_48._0_8_ = root;
  if (interleaved == 1) {
    uVar11 = nodeCount / 2;
  }
  else {
    uVar11 = 0;
    if (textured != '\0') {
      uVar11 = nodeCount;
    }
  }
  local_50 = this;
  if (uVar11 != 0 &&
      (long)texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar11) {
    do {
      pRVar1 = (local_50->super_StandardSurface).m_renderer._M_t.
               super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
               _M_t.
               super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
               super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
      bits = (uint *)operator_new__(8000);
      rengine::rengine_fractalTexture(bits,(vec2)0x41a0000042c80000);
      iVar6 = (*pRVar1->_vptr_Renderer[2])(0x42c80000,pRVar1,0x1001,bits);
      pTVar8 = (Texture *)CONCAT44(extraout_var,iVar6);
      operator_delete__(bits);
      local_70 = pTVar8;
      if (texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<rengine::Texture*,std::allocator<rengine::Texture*>>::
        _M_realloc_insert<rengine::Texture*>
                  ((vector<rengine::Texture*,std::allocator<rengine::Texture*>> *)&texturePool,
                   (iterator)
                   texturePool.
                   super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_70);
      }
      else {
        *texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = pTVar8;
        texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if ((long *)local_48._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 0x10))();
  }
  rengine::rengine_countFps()::frameCounter = rengine::rengine_countFps()::frameCounter + 1;
  lVar9 = std::chrono::_V2::steady_clock::now();
  if (rengine::rengine_countFps()::then + 1000000000 < lVar9) {
    local_48._0_8_ = (double)(lVar9 - rengine::rengine_countFps()::then) / 1000000000.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FPS: ",5);
    poVar10 = std::ostream::_M_insert<double>
                        ((double)rengine::rengine_countFps()::frameCounter / (double)local_48._0_8_)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    rengine::rengine_countFps()::frameCounter = 0;
    rengine::rengine_countFps()::then = lVar9;
  }
  local_58 = rengine::Node::create();
  (*((local_50->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
  iVar6 = nodeCount;
  if (0 < nodeCount) {
    uVar12 = 0;
    do {
      iVar7 = rand();
      local_48 = ZEXT416((uint)(float)(iVar7 % (int)(extraout_XMM0_Da + -100.0)));
      iVar7 = rand();
      fVar13 = (float)(iVar7 % (int)(extraout_XMM0_Db + -20.0));
      auVar4._4_4_ = fVar13;
      auVar4._0_4_ = local_48._0_4_;
      auVar4._8_4_ = local_48._4_4_;
      auVar4._12_4_ = 0;
      vVar3.y = fVar13 + 20.0;
      vVar3.x = (float)local_48._0_4_ + 100.0;
      local_48 = auVar4;
      if ((textured == '\0') && (((uVar12 & 1) == 0 || ((interleaved & 1) == 0)))) {
        iVar7 = rand();
        dVar2 = (double)(iVar7 % 100) / 100.0;
        local_68._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
        local_68._0_4_ = (float)dVar2;
        uStack_60 = 0;
        iVar7 = rand();
        uVar5 = local_68._4_4_;
        dVar2 = (double)(iVar7 % 100) / 100.0;
        local_68 = CONCAT44((float)dVar2,(float)local_68);
        uStack_60 = CONCAT44((int)((ulong)dVar2 >> 0x20),uVar5);
        iVar7 = rand();
        child = (TextureNode *)rengine::RectangleNode::create();
        auVar4 = local_48;
        rect_00.br = vVar3;
        rect_00.tl.x = (float)local_48._0_4_;
        rect_00.tl.y = (float)local_48._4_4_;
        local_48 = auVar4;
        rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)child,rect_00);
        color.w = 0.9;
        color.z = (float)(iVar7 % 100) / 100.0;
        color.x = (float)local_68;
        color.y = (float)local_68._4_4_;
        rengine::RectangleNode::setColor((RectangleNode *)child,color);
      }
      else {
        child = rengine::TextureNode::create();
        auVar4 = local_48;
        rect.br = vVar3;
        rect.tl.x = (float)local_48._0_4_;
        rect.tl.y = (float)local_48._4_4_;
        local_48 = auVar4;
        rengine::RectangleNodeBase::setGeometry(&child->super_RectangleNodeBase,rect);
        child->m_texture =
             texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12 >> 1];
      }
      rengine::Node::append(local_58,(Node *)child);
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (iVar6 != uVar11);
  }
  (*((local_50->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[8])();
  return local_58;
}

Assistant:

Node *update(Node *root) override {

        // if --textures, we have nodeCount textures (all the nodes)
        // if --interleaved, we have half of them.
        const unsigned int textureCount = interleaved ? nodeCount / 2 : (textured ? nodeCount : 0);

        if (texturePool.size() != textureCount) {
            for (unsigned int i=0; i<textureCount; ++i) {
                texturePool.push_back(rengine_fractalTexture(renderer(), vec2(100, 20)));
            }
        }

        if (root)
            root->destroy();

        rengine_countFps();

        root = Node::create();

        vec2 s = size();

        int rw = 100;
        int rh = 20;
        int w = s.x - rw;
        int h = s.y - rh;

        int count = nodeCount;

        for (int i=0; i<count; ++i) {

            rect2d geometry = rect2d::fromXywh(rand() % w, rand() % h, rw, rh);

            if (textured || (interleaved && (i % 2) == 1)) {
                TextureNode *tn = TextureNode::create();
                tn->setGeometry(geometry);
                tn->setTexture(texturePool[i / 2]);
                *root << tn;
            } else {
                vec4 color((rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           0.9);
                RectangleNode *rect = RectangleNode::create();
                rect->setGeometry(geometry);
                rect->setColor(color);
                *root << rect;
            }
        }

        requestRender();

        return root;
    }